

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

shared_ptr<duckdb::RowGroupCollection,_true> __thiscall
duckdb::RowGroupCollection::RemoveColumn(RowGroupCollection *this,idx_t col_idx)

{
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> uVar1;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var2;
  RowGroupCollection *pRVar3;
  pointer pBVar4;
  RowGroupSegmentTree *this_00;
  RowGroup *segment;
  type removed_column;
  RowGroupSegmentTree *this_01;
  RowGroupCollection *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::RowGroupCollection,_true> sVar5;
  undefined1 local_71;
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> new_row_group;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_68;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  result_lock;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  reference<RowGroupCollection> local_50;
  vector<duckdb::LogicalType,_true> new_types;
  
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&new_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(col_idx + 0x28));
  local_50._M_data = in_RDX;
  vector<duckdb::LogicalType,_true>::erase_at
            ((vector<duckdb::LogicalType,_true> *)
             &new_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             (idx_t)in_RDX);
  new_row_group.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
  super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl =
       *(unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)
        &((__uniq_ptr_data<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true,_true> *)
         (col_idx + 0x10))->
         super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>;
  result_lock.
  super_unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TableStatisticsLock_*,_std::default_delete<duckdb::TableStatisticsLock>_>
  .super__Head_base<0UL,_duckdb::TableStatisticsLock_*,_false>._M_head_impl =
       (unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>)
       (__uniq_ptr_data<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true,_true>
        )0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::RowGroupCollection,std::allocator<duckdb::RowGroupCollection>,duckdb::shared_ptr<duckdb::DataTableInfo,true>&,duckdb::BlockManager&,duckdb::vector<duckdb::LogicalType,true>,unsigned_long&,unsigned_long,unsigned_long_const&>
            (&local_58,(RowGroupCollection **)&result_lock,
             (allocator<duckdb::RowGroupCollection> *)&local_71,
             (shared_ptr<duckdb::DataTableInfo,_true> *)(col_idx + 0x18),*(BlockManager **)col_idx,
             &new_types,(unsigned_long *)(col_idx + 0x40),(unsigned_long *)&new_row_group,
             (unsigned_long *)(col_idx + 8));
  this->block_manager =
       (BlockManager *)
       result_lock.
       super_unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TableStatisticsLock_*,_std::default_delete<duckdb::TableStatisticsLock>_>
       .super__Head_base<0UL,_duckdb::TableStatisticsLock_*,_false>._M_head_impl;
  this->row_group_size = (idx_t)local_58._M_pi;
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
    }
  }
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  TableStatistics::InitializeRemoveColumn
            (&pRVar3->stats,(TableStatistics *)(col_idx + 0x58),(idx_t)local_50._M_data);
  shared_ptr<duckdb::RowGroupCollection,_true>::operator->
            ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  TableStatistics::GetLock((TableStatistics *)&result_lock);
  pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>::
  operator*(&result_lock);
  if ((pRVar3->stats).table_sample.
      super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
      super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
      .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl != (BlockingSample *)0x0)
  {
    pBVar4 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
             operator->(&(pRVar3->stats).table_sample);
    (*pBVar4->_vptr_BlockingSample[5])(pBVar4);
  }
  this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
                      ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)(col_idx + 0x48));
  segment = SegmentTree<duckdb::RowGroup,_true>::GetRootSegment
                      (&this_00->super_SegmentTree<duckdb::RowGroup,_true>);
  for (; segment != (RowGroup *)0x0;
      segment = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                          (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,segment)) {
    removed_column =
         shared_ptr<duckdb::RowGroupCollection,_true>::operator*
                   ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
    RowGroup::RemoveColumn
              ((RowGroup *)&new_row_group,(RowGroupCollection *)segment,(idx_t)removed_column);
    pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                       ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
    this_01 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&pRVar3->row_groups);
    local_68._M_head_impl =
         (RowGroup *)
         new_row_group.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
         _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
         super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
    new_row_group.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
    super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
    super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl =
         (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
         (__uniq_ptr_data<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true,_true>)0x0;
    SegmentTree<duckdb::RowGroup,_true>::AppendSegment
              (&this_01->super_SegmentTree<duckdb::RowGroup,_true>,
               (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               &local_68);
    _Var2._M_head_impl = local_68._M_head_impl;
    if ((_Head_base<0UL,_duckdb::RowGroup_*,_false>)local_68._M_head_impl !=
        (_Head_base<0UL,_duckdb::RowGroup_*,_false>)0x0) {
      RowGroup::~RowGroup(local_68._M_head_impl);
      operator_delete(_Var2._M_head_impl);
    }
    uVar1.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
    super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
    super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl =
         new_row_group.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
         _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
         super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
    local_68._M_head_impl = (RowGroup *)0x0;
    if (new_row_group.super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
        _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
        super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true,_true>)0x0) {
      RowGroup::~RowGroup((RowGroup *)
                          new_row_group.
                          super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>
                          .super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl);
      operator_delete((void *)uVar1.
                              super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>
                              .super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl);
    }
  }
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr(&result_lock.
                 super_unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
               );
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&new_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  sVar5.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::RowGroupCollection,_true>)
         sVar5.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<RowGroupCollection> RowGroupCollection::RemoveColumn(idx_t col_idx) {
	D_ASSERT(col_idx < types.size());
	auto new_types = types;
	new_types.erase_at(col_idx);

	auto result = make_shared_ptr<RowGroupCollection>(info, block_manager, std::move(new_types), row_start,
	                                                  total_rows.load(), row_group_size);
	result->stats.InitializeRemoveColumn(stats, col_idx);

	auto result_lock = result->stats.GetLock();
	result->stats.DestroyTableSample(*result_lock);

	for (auto &current_row_group : row_groups->Segments()) {
		auto new_row_group = current_row_group.RemoveColumn(*result, col_idx);
		result->row_groups->AppendSegment(std::move(new_row_group));
	}
	return result;
}